

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

int setupServer(Address *address)

{
  int iVar1;
  undefined1 local_28 [8];
  sockaddr_in server_addr;
  int ret;
  int sockfd;
  Address *address_local;
  
  server_addr.sin_zero._4_4_ = socket(2,1,0);
  if (server_addr.sin_zero._4_4_ == -1) {
    printf("socket creation failed...\n");
    exit(-1);
  }
  printf("\x1b[32m[+] Socket successfully created.\n\x1b[0m");
  memset(local_28,0,0x10);
  local_28._0_2_ = 2;
  local_28._4_4_ = htonl(0);
  local_28._2_2_ = htons((uint16_t)address->port);
  server_addr.sin_zero._0_4_ = bind(server_addr.sin_zero._4_4_,(sockaddr *)local_28,0x10);
  if (server_addr.sin_zero._0_4_ != 0) {
    perror_die("socket bind failed...\n");
  }
  server_addr.sin_zero._0_4_ = listen(server_addr.sin_zero._4_4_,10);
  if (server_addr.sin_zero._0_4_ == 0) {
    printf("\x1b[32m[+] Server listening on %s:%d\x1b[0m\n",address,(ulong)(uint)address->port);
  }
  else {
    perror_die("Listen()");
  }
  iVar1._0_1_ = server_addr.sin_zero[4];
  iVar1._1_1_ = server_addr.sin_zero[5];
  iVar1._2_1_ = server_addr.sin_zero[6];
  iVar1._3_1_ = server_addr.sin_zero[7];
  return iVar1;
}

Assistant:

int 
setupServer(Address* address)
{
    /* 
     * socket() -> bind() -> listen() [-> accept()]
     *                                      ^-------- out of the scope of this function. comes later.
     */

    int sockfd;          // listening socket file descriptor
    int ret;

    struct sockaddr_in server_addr;     // server address
    

    // socket create and verification
    sockfd = socket(AF_INET, SOCK_STREAM, 0);   // create socket and check return value
    if (sockfd == -1) {
        printf("socket creation failed...\n");
        exit(-1);
    }
    else {
        printf(ANSI_COLOR_GREEN "[+] Socket successfully created.\n" ANSI_COLOR_RESET);
    }
    memset(&server_addr, '\0', sizeof(server_addr));

    // assign ip and port
    server_addr.sin_family = AF_INET;
    server_addr.sin_addr.s_addr = htonl(INADDR_ANY);    // connect to any
    server_addr.sin_port = htons(address->port);        // port number

    // Binding newly created socket to given IP and verification

    ret = (bind(sockfd, (struct sockaddr*) &server_addr, sizeof(server_addr)));
    if (ret != 0) {
        perror_die("socket bind failed...\n");
    }

    // else
    //     printf("Socket successfully binded..\n");

    // Now server is ready to listen and verification
    ret = listen(sockfd, BACKLOG);
    if (ret != 0) {
        perror_die("Listen()");
    }
    else
        printf(ANSI_COLOR_GREEN "[+] Server listening on %s:%d" ANSI_COLOR_RESET "\n", address->ip, address->port);

    return sockfd;
}